

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

size_t fio_ftoa(char *dest,double num,uint8_t base)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,base);
  if ((iVar1 != 0x10) && (iVar1 != 2)) {
    iVar1 = sprintf(dest,"%g");
    sVar2 = (size_t)iVar1;
    pcVar3 = dest;
    while( true ) {
      if (*pcVar3 == ',') {
        *pcVar3 = '.';
      }
      else if (*pcVar3 == '\0') {
        (dest + sVar2)[0] = '.';
        (dest + sVar2)[1] = '0';
        return sVar2 + 2;
      }
      if (*pcVar3 == '.') break;
      if (*pcVar3 == 'e') {
        return sVar2;
      }
      pcVar3 = pcVar3 + 1;
    }
    return sVar2;
  }
  sVar2 = fio_ltoa(dest,(int64_t)num,base);
  return sVar2;
}

Assistant:

size_t fio_ftoa(char *dest, double num, uint8_t base) {
  if (base == 2 || base == 16) {
    /* handle the binary / Hex representation the same as if it were an
     * int64_t
     */
    int64_t *i = (void *)&num;
    return fio_ltoa(dest, *i, base);
  }

  size_t written = sprintf(dest, "%g", num);
  uint8_t need_zero = 1;
  char *start = dest;
  while (*start) {
    if (*start == ',') // locale issues?
      *start = '.';
    if (*start == '.' || *start == 'e') {
      need_zero = 0;
      break;
    }
    start++;
  }
  if (need_zero) {
    dest[written++] = '.';
    dest[written++] = '0';
  }
  return written;
}